

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O2

bool OpenMD::invertMatrix<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *AI)

{
  bool bVar1;
  int iScratch [10];
  Real dScratch [10];
  
  bVar1 = invertMatrix<OpenMD::SquareMatrix<double,6>>(A,AI,6,iScratch,dScratch);
  return bVar1;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI) {
    using Real = typename MatrixType::ElemType;

    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol()) {
      return false;
    }

    int size = A.getNRow();

    // Check on allocation of working vectors
    //
    int iScratch[MAX_SCRATCH_ARRAY_SIZE];
    int* index = (size <= MAX_SCRATCH_ARRAY_SIZE ? iScratch : new int[size]);
    Real dScratch[MAX_SCRATCH_ARRAY_SIZE];
    Real* column = (size <= MAX_SCRATCH_ARRAY_SIZE ? dScratch : new Real[size]);

    bool retVal = invertMatrix(A, AI, size, index, column);

    if (size > MAX_SCRATCH_ARRAY_SIZE) {
      delete[] index;
      delete[] column;
    }
    return retVal;
  }